

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Read(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uint local_68;
  uint local_64;
  int fSkipStrash;
  int fGiaSimple;
  int fVerbose;
  int fUseMini;
  int nArgcNew;
  int c;
  char *pTemp;
  char *FileName;
  char **pArgvNew;
  FILE *pFile;
  Gia_Man_t *pAig;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  local_64 = 0;
  local_68 = 0;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"csmvh"), iVar3 != -1) {
    switch(iVar3) {
    case 99:
      local_64 = local_64 ^ 1;
      break;
    default:
      Abc_Print(-2,"usage: &r [-csmvh] <file>\n");
      Abc_Print(-2,"\t         reads the current AIG from the AIGER file\n");
      pcVar4 = "no";
      if (local_64 != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggles reading simple AIG [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (local_68 == 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggles structural hashing while reading [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggles reading MiniAIG rather than AIGER file [default = %s]\n",
                pcVar4);
      pcVar4 = "no";
      if (bVar2) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : the file name\n");
      return 1;
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x73:
      local_68 = local_68 ^ 1;
      break;
    case 0x76:
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  if (argc - globalUtilOptind == 1) {
    pcVar4 = argv[globalUtilOptind];
    for (_nArgcNew = pcVar4; *_nArgcNew != '\0'; _nArgcNew = _nArgcNew + 1) {
      if (*_nArgcNew == '>') {
        *_nArgcNew = '\\';
      }
    }
    __stream = fopen(pcVar4,"r");
    if (__stream == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
      pcVar4 = Extra_FileGetSimilarName(pcVar4,".aig",".blif",".pla",".eqn",".bench");
      if (pcVar4 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
      }
      Abc_Print(1,"\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      fclose(__stream);
      if (bVar1) {
        pFile = (FILE *)Gia_ManReadMiniAig(pcVar4);
      }
      else {
        pFile = (FILE *)Gia_AigerRead(pcVar4,local_64,local_68,0);
      }
      if (pFile != (FILE *)0x0) {
        Abc_FrameUpdateGia(pAbc,(Gia_Man_t *)pFile);
      }
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_Print(-1,"There is no file name.\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9Read( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc3_ReadShowHie( char * pFileName, int fFlat );
    Gia_Man_t * pAig = NULL;
    FILE * pFile;
    char ** pArgvNew;
    char * FileName, * pTemp;
    int c, nArgcNew;
    int fUseMini = 0;
    int fVerbose = 0;
    int fGiaSimple = 0;
    int fSkipStrash = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "csmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 's':
            fSkipStrash ^= 1;
            break;
        case 'm':
            fUseMini ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", ".blif", ".pla", ".eqn", ".bench" )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    if ( fUseMini )
        pAig = Gia_ManReadMiniAig( FileName );
//    else if ( Extra_FileIsType( FileName, ".v", NULL, NULL ) )
//        Abc3_ReadShowHie( FileName, fSkipStrash );
    else 
        pAig = Gia_AigerRead( FileName, fGiaSimple, fSkipStrash, 0 );
    if ( pAig )
        Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &r [-csmvh] <file>\n" );
    Abc_Print( -2, "\t         reads the current AIG from the AIGER file\n" );
    Abc_Print( -2, "\t-c     : toggles reading simple AIG [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles structural hashing while reading [default = %s]\n", !fSkipStrash? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles reading MiniAIG rather than AIGER file [default = %s]\n", fUseMini? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}